

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrmem.c
# Opt level: O0

int mem_createmem(size_t msize,int *handle)

{
  char *pcVar1;
  int *in_RSI;
  size_t in_RDI;
  int ii;
  int local_1c;
  int local_4;
  
  *in_RSI = -1;
  local_1c = 0;
  do {
    if (9999 < local_1c) {
LAB_00119a30:
      if (*in_RSI == -1) {
        local_4 = 0x67;
      }
      else {
        memTable[local_1c].memaddrptr = (char **)((long)local_1c * 0x48 + 0x2d9688);
        memTable[local_1c].memsizeptr = (size_t *)((long)local_1c * 0x48 + 0x2d9698);
        if (in_RDI != 0) {
          pcVar1 = (char *)malloc(in_RDI);
          memTable[local_1c].memaddr = pcVar1;
          if (memTable[local_1c].memaddr == (char *)0x0) {
            ffpmsg((char *)0x119af4);
            return 0x68;
          }
        }
        memTable[local_1c].memsize = in_RDI;
        memTable[local_1c].deltasize = 0xb40;
        memTable[local_1c].fitsfilesize = 0;
        memTable[local_1c].currentpos = 0;
        memTable[local_1c].mem_realloc = realloc;
        local_4 = 0;
      }
      return local_4;
    }
    if (memTable[local_1c].memaddrptr == (char **)0x0) {
      *in_RSI = local_1c;
      goto LAB_00119a30;
    }
    local_1c = local_1c + 1;
  } while( true );
}

Assistant:

int mem_createmem(size_t msize, int *handle)
/* 
  lowest level routine to allocate a memory file.
*/
{
    int ii;

    *handle = -1;
    for (ii = 0; ii < NMAXFILES; ii++)  /* find empty slot in handle table */
    {
        if (memTable[ii].memaddrptr == 0)
        {
            *handle = ii;
            break;
        }
    }
    if (*handle == -1)
       return(TOO_MANY_FILES);    /* too many files opened */

    /* use the internally allocated memaddr and memsize variables */
    memTable[ii].memaddrptr = &memTable[ii].memaddr;
    memTable[ii].memsizeptr = &memTable[ii].memsize;

    /* allocate initial block of memory for the file */
    if (msize > 0)
    {
        memTable[ii].memaddr = (char *) malloc(msize); 
        if ( !(memTable[ii].memaddr) )
        {
            ffpmsg("malloc of initial memory failed (mem_createmem)");
            return(FILE_NOT_OPENED);
        }
    }

    /* set initial state of the file */
    memTable[ii].memsize = msize;
    memTable[ii].deltasize = 2880;
    memTable[ii].fitsfilesize = 0;
    memTable[ii].currentpos = 0;
    memTable[ii].mem_realloc = realloc;
    return(0);
}